

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

Token * __thiscall
embree::Stream<embree::Token>::get(Token *__return_storage_ptr__,Stream<embree::Token> *this)

{
  size_t sVar1;
  pointer ppVar2;
  _Alloc_hider _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ssize_t sVar5;
  anon_union_4_3_4e90a026_for_Token_2 aVar6;
  size_t sVar7;
  runtime_error *this_00;
  uint uVar8;
  ParseLocation l;
  ParseLocation PStack_f8;
  Token local_d8;
  pair<embree::Token,_embree::ParseLocation> local_90;
  
  if (this->future == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&PStack_f8,this);
    (*(this->super_RefCount)._vptr_RefCount[4])(&local_d8,this);
    std::pair<embree::Token,_embree::ParseLocation>::
    pair<embree::Token_&,_embree::ParseLocation_&,_true>(&local_90,&local_d8,&PStack_f8);
    if (local_d8.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.str._M_dataplus._M_p != &local_d8.str.field_2) {
      operator_delete(local_d8.str._M_dataplus._M_p);
    }
    if (PStack_f8.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (PStack_f8.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    sVar7 = this->past;
    sVar1 = this->future;
    if (sVar1 + sVar7 == 0x400) {
      if (sVar7 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = (int)this->start + 1U & 0x3ff;
      this->start = (ulong)uVar8;
      sVar7 = sVar7 - 1;
      this->past = sVar7;
    }
    else {
      uVar8 = (uint)this->start;
    }
    this->future = sVar1 + 1;
    std::pair<embree::Token,_embree::ParseLocation>::operator=
              ((this->buffer).
               super__Vector_base<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
               ._M_impl.super__Vector_impl_data._M_start + ((int)sVar7 + uVar8 + (int)sVar1 & 0x3ff)
               ,&local_90);
    if (local_90.second.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.second.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_90.first.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.first.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.first.str._M_dataplus._M_p != &local_90.first.str.field_2) {
      operator_delete(local_90.first.str._M_dataplus._M_p);
    }
  }
  uVar8 = (int)this->past + (int)this->start & 0x3ff;
  ppVar2 = (this->buffer).
           super__Vector_base<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  aVar6 = ppVar2[uVar8].first.field_1;
  __return_storage_ptr__->ty = ppVar2[uVar8].first.ty;
  __return_storage_ptr__->field_1 = aVar6;
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  _Var3._M_p = ppVar2[uVar8].first.str._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->str,_Var3._M_p,
             _Var3._M_p + ppVar2[uVar8].first.str._M_string_length);
  (__return_storage_ptr__->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = ppVar2[uVar8].first.loc.fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var4 = ppVar2[uVar8].first.loc.fileName.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (__return_storage_ptr__->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  sVar5 = ppVar2[uVar8].first.loc.colNumber;
  (__return_storage_ptr__->loc).lineNumber = ppVar2[uVar8].first.loc.lineNumber;
  (__return_storage_ptr__->loc).colNumber = sVar5;
  this->past = this->past + 1;
  this->future = this->future - 1;
  return __return_storage_ptr__;
}

Assistant:

T get() {
      if (future == 0) push_back(nextHelper());
      T t = buffer[(start+past)%BUF_SIZE].first;
      past++; future--;
      return t;
    }